

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O2

void get_thickness_adjustments
               (Am_Style *ls,int *lt_adjustment,int *rb_adjustment,int *wh_adjustment)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  short sVar3;
  int iVar4;
  int iVar5;
  undefined8 uStack_38;
  Am_Line_Cap_Style_Flag cap;
  
  uStack_38 = in_RAX;
  bVar1 = Am_Style::Valid(ls);
  if (bVar1) {
    Am_Style::Get_Line_Thickness_Values(ls,(short *)((long)register0x00000020 + -0x36),&cap);
    sVar3 = uStack_38._2_2_ + (ushort)(uStack_38._2_2_ == 0);
    if (cap == Am_CAP_PROJECTING) {
      iVar5 = (int)sVar3;
      iVar4 = iVar5 * 2;
      iVar2 = iVar5;
    }
    else {
      iVar5 = (int)(sVar3 / 2);
      iVar4 = (int)sVar3;
      iVar2 = (iVar4 + 1) / 2;
    }
    *lt_adjustment = iVar5;
    *rb_adjustment = iVar2;
    *wh_adjustment = iVar4;
  }
  else {
    *lt_adjustment = 0;
    *rb_adjustment = 0;
    *wh_adjustment = 1;
  }
  return;
}

Assistant:

void
get_thickness_adjustments(const Am_Style &ls, int &lt_adjustment,
                          int &rb_adjustment, int &wh_adjustment)
{
  if (ls.Valid()) {
    Am_Line_Cap_Style_Flag cap;
    short thickness;
    ls.Get_Line_Thickness_Values(thickness, cap);
    thickness = thickness ? thickness : 1;
    if (cap == Am_CAP_PROJECTING) {
      lt_adjustment = thickness;
      rb_adjustment = thickness;
      wh_adjustment = (2 * thickness);
    } else {
      lt_adjustment = thickness / 2;
      rb_adjustment = (thickness + 1) / 2;
      wh_adjustment = thickness;
    }
  } else {
    lt_adjustment = 0;
    rb_adjustment = 0;
    wh_adjustment = 1;
  }
}